

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UnaryOperatorWrapper,duckdb::BitwiseNotOperator>
               (hugeint_t *ldata,hugeint_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar3;
  uint64_t uVar4;
  int64_t iVar5;
  TemplatedValidityData<unsigned_long> *pTVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  hugeint_t hVar12;
  hugeint_t local_68;
  idx_t local_58;
  ValidityMask *local_50;
  ulong local_48;
  ulong local_40;
  idx_t local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_50 = mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar11 = 0;
      do {
        puVar1 = (uint64_t *)((long)&ldata->lower + lVar11);
        local_68.lower = *puVar1;
        local_68.upper = puVar1[1];
        hVar12 = hugeint_t::operator~(&local_68);
        *(uint64_t *)((long)&result_data->lower + lVar11) = hVar12.lower;
        *(int64_t *)((long)&result_data->upper + lVar11) = hVar12.upper;
        lVar11 = lVar11 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_68,(unsigned_long **)mask,&local_38);
      iVar5 = local_68.upper;
      uVar4 = local_68.lower;
      local_68.lower = 0;
      local_68.upper = 0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar4;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar5;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.upper !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.upper);
      }
      pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar6->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_40 = count + 0x3f >> 6;
      local_48 = 0;
      uVar9 = 0;
      local_58 = count;
      do {
        puVar2 = (local_50->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar7 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar7 = count;
          }
LAB_0101a2ac:
          uVar8 = uVar9;
          if (uVar9 < uVar7) {
            lVar11 = uVar9 << 4;
            do {
              puVar1 = (uint64_t *)((long)&ldata->lower + lVar11);
              local_68.lower = *puVar1;
              local_68.upper = puVar1[1];
              hVar12 = hugeint_t::operator~(&local_68);
              *(uint64_t *)((long)&result_data->lower + lVar11) = hVar12.lower;
              *(int64_t *)((long)&result_data->upper + lVar11) = hVar12.upper;
              uVar9 = uVar9 + 1;
              lVar11 = lVar11 + 0x10;
              uVar8 = uVar7;
              count = local_58;
            } while (uVar7 != uVar9);
          }
        }
        else {
          uVar3 = puVar2[local_48];
          uVar7 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar7 = count;
          }
          uVar8 = uVar7;
          if (uVar3 != 0) {
            if (uVar3 == 0xffffffffffffffff) goto LAB_0101a2ac;
            uVar8 = uVar9;
            count = local_58;
            if (uVar9 < uVar7) {
              lVar11 = uVar9 << 4;
              uVar10 = 0;
              do {
                if ((uVar3 >> (uVar10 & 0x3f) & 1) != 0) {
                  puVar1 = (uint64_t *)((long)&ldata->lower + lVar11);
                  local_68.lower = *puVar1;
                  local_68.upper = puVar1[1];
                  hVar12 = hugeint_t::operator~(&local_68);
                  *(uint64_t *)((long)&result_data->lower + lVar11) = hVar12.lower;
                  *(int64_t *)((long)&result_data->upper + lVar11) = hVar12.upper;
                }
                uVar10 = uVar10 + 1;
                lVar11 = lVar11 + 0x10;
                uVar8 = uVar7;
                count = local_58;
              } while (uVar7 - uVar9 != uVar10);
            }
          }
        }
        local_48 = local_48 + 1;
        uVar9 = uVar8;
      } while (local_48 != local_40);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}